

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_>::MidSideNodeIndex
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoTriangle>_> *this,int side,
          int64_t *index)

{
  int iVar1;
  ostream *this_00;
  void *this_01;
  undefined8 uVar2;
  undefined8 *in_RDX;
  int in_ESI;
  long *in_RDI;
  
  *in_RDX = 0xffffffffffffffff;
  if ((-1 < in_ESI) && (iVar1 = (**(code **)(*in_RDI + 0xf0))(), in_ESI <= iVar1 + -1)) {
    iVar1 = (**(code **)(*in_RDI + 0x90))();
    if (iVar1 <= in_ESI) {
      return;
    }
    uVar2 = (**(code **)(*in_RDI + 0xa8))(in_RDI,in_ESI);
    *in_RDX = uVar2;
    return;
  }
  this_00 = std::operator<<((ostream *)&std::cerr,
                            "TPZGeoElRefLess<TGeo>::MidSideNodeIndex. Bad parameter side = ");
  this_01 = (void *)std::ostream::operator<<(this_00,in_ESI);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::MidSideNodeIndex(int side,int64_t &index) const{
	//TRef::MidSideNodeIndex(this,side,index);
	index = -1;
	if(side<0 || side>NSides()-1) {
		PZError << "TPZGeoElRefLess<TGeo>::MidSideNodeIndex. Bad parameter side = " << side << std::endl;
		return;
	}
	if(side<NNodes()) {//o n�medio do lado 0 �o 0 etc.
		index = NodeIndex(side);
		return;
	}
}